

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateGroupNonUniformBroadcastFirst
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  DiagnosticStream *pDVar2;
  DiagnosticStream local_3e0;
  uint32_t local_204;
  undefined1 local_200 [4];
  uint32_t value_type_id;
  uint32_t local_24;
  Instruction *pIStack_20;
  uint32_t type_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = val::Instruction::type_id(inst);
  bVar1 = ValidationState_t::IsFloatScalarOrVectorType((ValidationState_t *)inst_local,local_24);
  if (((!bVar1) &&
      (bVar1 = ValidationState_t::IsIntScalarOrVectorType((ValidationState_t *)inst_local,local_24),
      !bVar1)) &&
     (bVar1 = ValidationState_t::IsBoolScalarOrVectorType((ValidationState_t *)inst_local,local_24),
     !bVar1)) {
    ValidationState_t::diag
              ((DiagnosticStream *)local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               pIStack_20);
    pDVar2 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_200,
                        (char (*) [78])
                        "Result must be a scalar or vector of integer, floating-point, or boolean type"
                       );
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_200);
    return __local._4_4_;
  }
  local_204 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,pIStack_20,3);
  if (local_204 == local_24) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag
              (&local_3e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
    pDVar2 = DiagnosticStream::operator<<
                       (&local_3e0,(char (*) [45])"The type of Value must match the Result type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    DiagnosticStream::~DiagnosticStream(&local_3e0);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateGroupNonUniformBroadcastFirst(ValidationState_t& _,
                                                   const Instruction* inst) {
  const auto type_id = inst->type_id();
  if (!_.IsFloatScalarOrVectorType(type_id) &&
      !_.IsIntScalarOrVectorType(type_id) &&
      !_.IsBoolScalarOrVectorType(type_id)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result must be a scalar or vector of integer, floating-point, "
              "or boolean type";
  }

  const auto value_type_id = _.GetOperandTypeId(inst, 3);
  if (value_type_id != type_id) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The type of Value must match the Result type";
  }

  return SPV_SUCCESS;
}